

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise::create_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  float fVar1;
  value_type pLVar2;
  Mat *pMVar3;
  bool bVar4;
  float *pfVar5;
  Layer *pLVar6;
  reference ppLVar7;
  undefined8 *in_RSI;
  long in_RDI;
  Mat weights [1];
  ParamDict pd_2;
  float top_rescale;
  int g_2;
  ParamDict pd_1;
  int g_1;
  Mat int8_weight_data_g;
  Mat weight_data_g;
  Option opt_q;
  ParamDict pd;
  Layer *op;
  int g;
  int weight_data_size_g;
  Mat int8_weight_data;
  bool weight_data_is_float32;
  bool weight_data_is_int8;
  Mat *in_stack_ffffffffffffe278;
  int in_stack_ffffffffffffe280;
  int in_stack_ffffffffffffe284;
  undefined4 in_stack_ffffffffffffe288;
  int in_stack_ffffffffffffe28c;
  Mat *in_stack_ffffffffffffe290;
  size_type in_stack_ffffffffffffe298;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *in_stack_ffffffffffffe2a0;
  Mat *local_1d50;
  Mat *in_stack_ffffffffffffe2c0;
  Mat *local_1d28;
  bool local_1cd3;
  bool local_1cd2;
  bool local_1cd1;
  undefined1 local_1cc8 [80];
  Mat local_1c78;
  ParamDict local_1c38;
  float local_1338;
  int local_1334;
  ParamDict local_1330;
  int local_a2c;
  undefined1 local_a28 [64];
  undefined1 local_9e8 [64];
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined4 local_998;
  undefined4 uStack_994;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  undefined8 local_988;
  ParamDict local_980;
  Layer *local_80;
  int local_78;
  int local_74;
  int local_70;
  undefined8 local_40;
  undefined1 local_1a;
  undefined1 local_19;
  undefined8 *local_18;
  int local_4;
  
  local_19 = *(long *)(in_RDI + 0x118) == 1;
  local_1a = *(long *)(in_RDI + 0x118) == 4;
  if (((bool)local_19) && ((*(byte *)((long)in_RSI + 0x1a) & 1) == 0)) {
    fprintf(_stderr,"quantized int8 weight loaded but use_int8_inference disabled\n");
    local_4 = -1;
  }
  else {
    local_1cd1 = false;
    if ((*(byte *)((long)in_RSI + 0x1a) & 1) != 0) {
      local_1cd2 = true;
      if (!(bool)local_19) {
        local_1cd3 = false;
        if ((bool)local_1a) {
          local_1cd3 = *(int *)(in_RDI + 0xbc) != 0;
        }
        local_1cd2 = local_1cd3;
      }
      local_1cd1 = local_1cd2;
    }
    *(bool *)(in_RDI + 0x20c) = local_1cd1;
    local_1d28 = in_stack_ffffffffffffe2c0;
    local_18 = in_RSI;
    if (((bool)local_1a) && ((*(byte *)(in_RDI + 0x20c) & 1) != 0)) {
      Mat::Mat(in_stack_ffffffffffffe290,in_stack_ffffffffffffe28c,
               CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280),
               (Allocator *)in_stack_ffffffffffffe278);
      bVar4 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280));
      if (bVar4) {
        local_4 = -100;
        local_70 = 1;
      }
      else {
        local_74 = *(int *)(in_RDI + 0xb4) / *(int *)(in_RDI + 0xb8);
        for (local_78 = 0; local_78 < *(int *)(in_RDI + 0xb8); local_78 = local_78 + 1) {
          local_80 = create_layer(in_stack_ffffffffffffe28c);
          ParamDict::ParamDict((ParamDict *)in_stack_ffffffffffffe2c0);
          pfVar5 = Mat::operator[]((Mat *)(in_RDI + 0x188),local_78);
          ParamDict::set(&local_980,0,*pfVar5);
          (*local_80->_vptr_Layer[2])(local_80,&local_980);
          (*local_80->_vptr_Layer[4])(local_80,local_18);
          local_988 = local_18[4];
          local_9a8 = *local_18;
          local_998 = *(undefined4 *)(local_18 + 2);
          uStack_994 = *(undefined4 *)((long)local_18 + 0x14);
          uStack_990 = *(undefined4 *)(local_18 + 3);
          uStack_98c = *(undefined4 *)((long)local_18 + 0x1c);
          uStack_9a0 = local_40;
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffe28c,in_stack_ffffffffffffe288),
                     in_stack_ffffffffffffe284,in_stack_ffffffffffffe280);
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffe28c,in_stack_ffffffffffffe288),
                     in_stack_ffffffffffffe284,in_stack_ffffffffffffe280);
          (*local_80->_vptr_Layer[7])(local_80,local_9e8,local_a28,&local_9a8);
          if (local_80 != (Layer *)0x0) {
            (*local_80->_vptr_Layer[1])();
          }
          Mat::~Mat((Mat *)0x19e37f);
          Mat::~Mat((Mat *)0x19e38c);
          ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffe290);
        }
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffe28c,in_stack_ffffffffffffe288),
                       (Mat *)CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280));
        local_70 = 0;
      }
      Mat::~Mat((Mat *)0x19e44e);
      local_1d28 = in_stack_ffffffffffffe2c0;
      if (local_70 != 0) {
        return local_4;
      }
    }
    if ((*(byte *)(in_RDI + 0x20c) & 1) != 0) {
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                (in_stack_ffffffffffffe2a0,in_stack_ffffffffffffe298);
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                (in_stack_ffffffffffffe2a0,in_stack_ffffffffffffe298);
      for (local_a2c = 0; local_a2c < *(int *)(in_RDI + 0xb8); local_a2c = local_a2c + 1) {
        pLVar6 = create_layer(in_stack_ffffffffffffe28c);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x210),(long)local_a2c);
        *ppLVar7 = pLVar6;
        ParamDict::ParamDict((ParamDict *)local_1d28);
        pfVar5 = Mat::operator[]((Mat *)(in_RDI + 0x1c8),local_a2c);
        ParamDict::set(&local_1330,0,*pfVar5);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x210),(long)local_a2c);
        (*(*ppLVar7)->_vptr_Layer[2])(*ppLVar7,&local_1330);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x210),(long)local_a2c);
        (*(*ppLVar7)->_vptr_Layer[4])(*ppLVar7,local_18);
        ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffe290);
      }
      for (local_1334 = 0; local_1334 < *(int *)(in_RDI + 0xb8); local_1334 = local_1334 + 1) {
        pLVar6 = create_layer(in_stack_ffffffffffffe28c);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x228),(long)local_1334);
        *ppLVar7 = pLVar6;
        local_1338 = 1.0;
        pfVar5 = Mat::operator[]((Mat *)(in_RDI + 0x188),local_1334);
        if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) {
          pfVar5 = Mat::operator[]((Mat *)(in_RDI + 0x1c8),local_1334);
          fVar1 = *pfVar5;
          pfVar5 = Mat::operator[]((Mat *)(in_RDI + 0x188),local_1334);
          local_1338 = 1.0 / (fVar1 * *pfVar5);
        }
        else {
          local_1338 = 0.0;
        }
        ParamDict::ParamDict((ParamDict *)local_1d28);
        ParamDict::set(&local_1c38,0,local_1338);
        ParamDict::set(&local_1c38,1,*(int *)(in_RDI + 0xb0));
        ParamDict::set(&local_1c38,2,1);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x228),(long)local_1334);
        (*(*ppLVar7)->_vptr_Layer[2])(*ppLVar7,&local_1c38);
        pMVar3 = &local_1c78;
        do {
          local_1d28 = pMVar3;
          Mat::Mat(local_1d28);
          pMVar3 = local_1d28 + 1;
        } while (local_1d28 + 1 != (Mat *)&local_1c38);
        Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffe28c,in_stack_ffffffffffffe288),
                   in_stack_ffffffffffffe284,in_stack_ffffffffffffe280);
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffe28c,in_stack_ffffffffffffe288),
                       (Mat *)CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280));
        Mat::~Mat((Mat *)0x19e84b);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x228),(long)local_1334);
        pLVar2 = *ppLVar7;
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)
                   CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280),
                   in_stack_ffffffffffffe278);
        (*pLVar2->_vptr_Layer[3])(pLVar2,local_1cc8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x19e8ab);
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x228),(long)local_1334);
        (*(*ppLVar7)->_vptr_Layer[4])(*ppLVar7,local_18);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe290,
                   (value_type_conflict *)
                   CONCAT44(in_stack_ffffffffffffe28c,in_stack_ffffffffffffe288));
        local_1d50 = (Mat *)&local_1c38;
        do {
          local_1d50 = local_1d50 + -1;
          Mat::~Mat((Mat *)0x19e924);
        } while (local_1d50 != &local_1c78);
        ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffe290);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ConvolutionDepthWise::create_pipeline(const Option& opt)
{
    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !opt.use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    use_int8_inference = opt.use_int8_inference && (weight_data_is_int8 || (weight_data_is_float32 && int8_scale_term));

    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g=0; g<group; g++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[g]);// scale

            op->load_param(pd);

            op->create_pipeline(opt);

            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            op->forward(weight_data_g, int8_weight_data_g, opt_q);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    if (use_int8_inference)
    {
        quantize_ops.resize(group);
        dequantize_ops.resize(group);

        for (int g=0; g<group; g++)
        {
            quantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scales[g]);// scale

            quantize_ops[g]->load_param(pd);

            quantize_ops[g]->create_pipeline(opt);
        }

        for (int g=0; g<group; g++)
        {
            dequantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f;
            if (weight_data_int8_scales[g] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, 1);// bias_data_size

            dequantize_ops[g]->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(g, 1);

            dequantize_ops[g]->load_model(ModelBinFromMatArray(weights));

            dequantize_ops[g]->create_pipeline(opt);

            dequantize_scales.push_back(top_rescale);
        }
    }

    return 0;
}